

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O2

void lj_err_argtype(lua_State *L,int narg,char *xname)

{
  uint uVar1;
  ulong uVar2;
  TValue *pTVar3;
  char **ppcVar4;
  char *msg;
  TValue *pTVar5;
  ulong uStack_20;
  
  if (narg < -9999) {
    if (0xffffd8ed < (uint)narg) {
      ppcVar4 = lj_obj_itypename + 0xb;
      goto LAB_0010e570;
    }
    uVar2 = (ulong)L->base[-1].u32.lo;
    if ((uint)*(byte *)(uVar2 + 7) < -narg - 0x2712U) goto LAB_0010e545;
    uVar1 = *(uint *)(uVar2 + 0x24 + (ulong)(-narg - 0x2713) * 8);
  }
  else {
    if (narg < 0) {
      pTVar3 = L->top;
      pTVar5 = pTVar3 + narg;
    }
    else {
      pTVar3 = L->top;
      pTVar5 = L->base + ((ulong)(uint)narg - 1);
    }
    if (pTVar3 <= pTVar5) {
LAB_0010e545:
      ppcVar4 = lj_obj_typename;
      goto LAB_0010e570;
    }
    uVar1 = (pTVar5->field_2).it;
  }
  if (uVar1 < 0xffff0000) {
    uStack_20 = 0xd;
  }
  else if ((uVar1 & 0xffff8000) == 0xffff0000) {
    uStack_20 = 3;
  }
  else {
    uStack_20 = (ulong)~uVar1;
  }
  ppcVar4 = lj_obj_itypename + uStack_20;
LAB_0010e570:
  msg = lj_strfmt_pushf(L,lj_err_allmsg + 0x205,xname,*ppcVar4);
  err_argmsg(L,narg,msg);
}

Assistant:

LJ_NOINLINE void lj_err_argtype(lua_State *L, int narg, const char *xname)
{
  const char *tname, *msg;
  if (narg <= LUA_REGISTRYINDEX) {
    if (narg >= LUA_GLOBALSINDEX) {
      tname = lj_obj_itypename[~LJ_TTAB];
    } else {
      GCfunc *fn = curr_func(L);
      int idx = LUA_GLOBALSINDEX - narg;
      if (idx <= fn->c.nupvalues)
	tname = lj_typename(&fn->c.upvalue[idx-1]);
      else
	tname = lj_obj_typename[0];
    }
  } else {
    TValue *o = narg < 0 ? L->top + narg : L->base + narg-1;
    tname = o < L->top ? lj_typename(o) : lj_obj_typename[0];
  }
  msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADTYPE), xname, tname);
  err_argmsg(L, narg, msg);
}